

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_ptr_queue.hpp
# Opt level: O3

void __thiscall
so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::schedule
          (mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this,
          agent_queue_t *queue)

{
  iterator *piVar1;
  _Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false> _Var2;
  _Elt_pointer ppaVar3;
  agent_queue_t *local_20;
  
  _Var2._M_head_impl =
       (this->m_lock)._M_t.
       super___uniq_ptr_impl<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>._M_head_impl;
  local_20 = queue;
  (*(_Var2._M_head_impl)->_vptr_lock_t[2])(_Var2._M_head_impl);
  ppaVar3 = (this->m_queue).
            super__Deque_base<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppaVar3 ==
      (this->m_queue).
      super__Deque_base<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<so_5::disp::adv_thread_pool::impl::agent_queue_t*,std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t*>>
    ::_M_push_back_aux<so_5::disp::adv_thread_pool::impl::agent_queue_t*const&>
              ((deque<so_5::disp::adv_thread_pool::impl::agent_queue_t*,std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t*>>
                *)&this->m_queue,&local_20);
  }
  else {
    *ppaVar3 = queue;
    piVar1 = &(this->m_queue).
              super__Deque_base<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  try_wakeup_someone_if_possible(this);
  (*(_Var2._M_head_impl)->_vptr_lock_t[3])(_Var2._M_head_impl);
  return;
}

Assistant:

void
		schedule( T * queue )
			{
				std::lock_guard< so_5::disp::mpmc_queue_traits::lock_t > lock{ *m_lock };

				m_queue.push_back( queue );

				try_wakeup_someone_if_possible();
			}